

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O2

int PrecSetupBD(N_Vector cc,N_Vector cscale,N_Vector fval,N_Vector fscale,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  sunrealtype *cxy;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  long local_100;
  sunrealtype perturb_rates [6];
  
  dVar1 = *(double *)((long)user_data + 0x438);
  dVar2 = *(double *)((long)user_data + 0x440);
  dVar17 = *(double *)((long)user_data + 0x448);
  dVar3 = *(double *)((long)user_data + 0x450);
  dVar15 = (double)N_VWL2Norm(fval,fscale);
  dVar17 = dVar17 * 1000.0 * dVar15 * 384.0;
  uVar14 = -(ulong)(dVar17 == 0.0);
  local_100 = 0;
  lVar13 = 0;
  do {
    if (lVar13 == 8) {
      return 0;
    }
    lVar10 = 0;
    lVar9 = local_100;
    while (lVar10 != 8) {
      lVar7 = *(long *)((long)user_data + lVar13 * 8 + lVar10 * 0x40);
      lVar12 = (lVar10 * 6 + lVar13 * 0x30) * 8;
      cxy = (sunrealtype *)(*(long *)((long)cc->content + 0x10) + lVar12);
      lVar4 = *(long *)((long)cscale->content + 0x10);
      lVar5 = *(long *)(**(long **)((long)user_data + 0x410) + 0x10);
      for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
        dVar15 = cxy[lVar11];
        dVar16 = ABS(dVar15) * dVar3;
        dVar18 = (double)(uVar14 & 0x3ff0000000000000 | ~uVar14 & (ulong)dVar17) /
                 *(double *)(lVar12 + lVar4 + lVar11 * 8);
        if (dVar16 <= dVar18) {
          dVar16 = dVar18;
        }
        cxy[lVar11] = dVar15 + dVar16;
        WebRate((double)lVar10 * dVar1,(double)lVar13 * dVar2,cxy,perturb_rates,user_data);
        cxy[lVar11] = dVar15;
        lVar6 = *(long *)(lVar7 + lVar11 * 8);
        for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
          *(double *)(lVar6 + lVar8 * 8) =
               (perturb_rates[lVar8] - *(double *)(lVar5 + lVar9 + lVar8 * 8)) * (1.0 / dVar16);
        }
      }
      lVar7 = SUNDlsMat_denseGETRF
                        (lVar7,6,6,
                         *(undefined8 *)((long)user_data + lVar13 * 8 + lVar10 * 0x40 + 0x200));
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x30;
      if (lVar7 != 0) {
        return 1;
      }
    }
    lVar13 = lVar13 + 1;
    local_100 = local_100 + 0x180;
  } while( true );
}

Assistant:

static int PrecSetupBD(N_Vector cc, N_Vector cscale, N_Vector fval,
                       N_Vector fscale, void* user_data)
{
  sunrealtype r, r0, uround, sqruround, xx, yy, delx, dely, csave, fac;
  sunrealtype *cxy, *scxy, **Pxy, *ratesxy, *Pxycol, perturb_rates[NUM_SPECIES];
  sunindextype i, j, jx, jy, ret;
  UserData data;

  data = (UserData)user_data;
  delx = data->dx;
  dely = data->dy;

  uround    = data->uround;
  sqruround = data->sqruround;
  fac       = N_VWL2Norm(fval, fscale);
  r0        = THOUSAND * uround * fac * NEQ;
  if (r0 == ZERO) { r0 = ONE; }

  /* Loop over spatial points; get size NUM_SPECIES Jacobian block at each */
  for (jy = 0; jy < MY; jy++)
  {
    yy = jy * dely;

    for (jx = 0; jx < MX; jx++)
    {
      xx      = jx * delx;
      Pxy     = (data->P)[jx][jy];
      cxy     = IJ_Vptr(cc, jx, jy);
      scxy    = IJ_Vptr(cscale, jx, jy);
      ratesxy = IJ_Vptr((data->rates), jx, jy);

      /* Compute difference quotients of interaction rate fn. */
      for (j = 0; j < NUM_SPECIES; j++)
      {
        csave = cxy[j]; /* Save the j,jx,jy element of cc */
        r     = SUNMAX(sqruround * SUNRabs(csave), r0 / scxy[j]);
        cxy[j] += r; /* Perturb the j,jx,jy element of cc */
        fac = ONE / r;

        WebRate(xx, yy, cxy, perturb_rates, data);

        /* Restore j,jx,jy element of cc */
        cxy[j] = csave;

        /* Load the j-th column of difference quotients */
        Pxycol = Pxy[j];
        for (i = 0; i < NUM_SPECIES; i++)
        {
          Pxycol[i] = (perturb_rates[i] - ratesxy[i]) * fac;
        }

      } /* end of j loop */

      /* Do LU decomposition of size NUM_SPECIES preconditioner block */
      ret = SUNDlsMat_denseGETRF(Pxy, NUM_SPECIES, NUM_SPECIES,
                                 (data->pivot)[jx][jy]);
      if (ret != 0) { return (1); }

    } /* end of jx loop */

  } /* end of jy loop */

  return (0);
}